

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O2

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
assignPWproduct4setup<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *x,
          SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *y)

{
  pointer pnVar1;
  int *piVar2;
  int *piVar3;
  int iVar4;
  int *piVar5;
  long lVar6;
  int iVar7;
  int *piVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  pointer pnVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  long lVar12;
  uint *puVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  long lVar19;
  long lVar20;
  byte bVar21;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<200U,_int,_void> local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar21 = 0;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::clear((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  this[0x38] = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200u,int,void>,(boost::multiprecision::expression_template_option)0>>
                )0x0;
  lVar17 = (long)(x->super_IdxSet).num;
  lVar6 = (long)(y->super_IdxSet).num;
  if (0 < lVar6 && 0 < lVar17) {
    lVar17 = lVar17 + -1;
    lVar6 = lVar6 + -1;
    piVar3 = (x->super_IdxSet).idx;
    piVar2 = (y->super_IdxSet).idx;
    iVar18 = 0;
    lVar16 = 0x1c;
    uVar15 = 0;
    piVar5 = piVar3;
    piVar8 = piVar2;
    do {
      iVar4 = *piVar5;
LAB_0043140f:
      iVar7 = *piVar8;
      uVar15 = (ulong)(int)uVar15;
      while( true ) {
        lVar12 = (long)iVar18;
        if (((int)lVar17 <= (int)uVar15) || ((int)lVar6 <= iVar18)) goto LAB_004315a9;
        if (iVar4 == iVar7) break;
        if (iVar7 <= iVar4) goto LAB_0043143a;
        uVar15 = uVar15 + 1;
        iVar4 = piVar3[(int)uVar15];
      }
      lVar19 = (long)iVar4;
      pnVar1 = (x->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar20 = lVar19 * 0x80;
      pnVar10 = pnVar1 + lVar19;
      pcVar11 = &local_b0;
      for (lVar12 = lVar16; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar21 * -8 + 4);
      }
      local_b0.exp = pnVar1[lVar19].m_backend.exp;
      local_b0.neg = pnVar1[lVar19].m_backend.neg;
      local_b0.fpclass = pnVar1[lVar19].m_backend.fpclass;
      local_b0.prec_elem = pnVar1[lVar19].m_backend.prec_elem;
      pnVar1 = (y->
               super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).val.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pnVar10 = pnVar1 + lVar19;
      pcVar11 = &local_130;
      for (lVar12 = lVar16; lVar12 != 0; lVar12 = lVar12 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
        pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar21 * -2 + 1) * 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar21 * -8 + 4);
      }
      local_130.exp = pnVar1[lVar19].m_backend.exp;
      local_130.neg = pnVar1[lVar19].m_backend.neg;
      local_130.fpclass = pnVar1[lVar19].m_backend.fpclass;
      local_130.prec_elem = pnVar1[lVar19].m_backend.prec_elem;
      result.m_backend.fpclass = cpp_dec_float_finite;
      result.m_backend.prec_elem = 0x1c;
      result.m_backend.data._M_elems[0] = 0;
      result.m_backend.data._M_elems[1] = 0;
      result.m_backend.data._M_elems[2] = 0;
      result.m_backend.data._M_elems[3] = 0;
      result.m_backend.data._M_elems[4] = 0;
      result.m_backend.data._M_elems[5] = 0;
      result.m_backend.data._M_elems[6] = 0;
      result.m_backend.data._M_elems[7] = 0;
      result.m_backend.data._M_elems[8] = 0;
      result.m_backend.data._M_elems[9] = 0;
      result.m_backend.data._M_elems[10] = 0;
      result.m_backend.data._M_elems[0xb] = 0;
      result.m_backend.data._M_elems[0xc] = 0;
      result.m_backend.data._M_elems[0xd] = 0;
      result.m_backend.data._M_elems[0xe] = 0;
      result.m_backend.data._M_elems[0xf] = 0;
      result.m_backend.data._M_elems[0x10] = 0;
      result.m_backend.data._M_elems[0x11] = 0;
      result.m_backend.data._M_elems[0x12] = 0;
      result.m_backend.data._M_elems[0x13] = 0;
      result.m_backend.data._M_elems[0x14] = 0;
      result.m_backend.data._M_elems[0x15] = 0;
      result.m_backend.data._M_elems[0x16] = 0;
      result.m_backend.data._M_elems[0x17] = 0;
      result.m_backend.data._M_elems[0x18] = 0;
      result.m_backend.data._M_elems[0x19] = 0;
      result.m_backend.data._M_elems._104_5_ = 0;
      result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
      result.m_backend.exp = 0;
      result.m_backend.neg = false;
      boost::multiprecision::default_ops::
      eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                (&result.m_backend,&local_b0,&local_130);
      lVar12 = *(long *)(this + 0x20);
      pnVar9 = &result;
      puVar13 = (uint *)(lVar12 + lVar20);
      for (lVar19 = lVar16; lVar19 != 0; lVar19 = lVar19 + -1) {
        *puVar13 = (pnVar9->m_backend).data._M_elems[0];
        pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)((long)pnVar9 + ((ulong)bVar21 * -2 + 1) * 4);
        puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
      }
      *(int *)(lVar12 + 0x70 + lVar20) = result.m_backend.exp;
      *(bool *)(lVar12 + 0x74 + lVar20) = result.m_backend.neg;
      *(undefined8 *)(lVar12 + 0x78 + lVar20) = result.m_backend._120_8_;
      uVar14 = (int)uVar15 + 1;
      uVar15 = (ulong)uVar14;
      piVar3 = (x->super_IdxSet).idx;
      piVar5 = piVar3 + (int)uVar14;
      piVar2 = (y->super_IdxSet).idx;
      lVar12 = (long)iVar18;
      iVar18 = iVar18 + 1;
      piVar8 = piVar2 + lVar12 + 1;
    } while( true );
  }
LAB_004316ad:
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::setup((SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *)this);
  return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *)this;
LAB_004315a9:
  while (((long)uVar15 < lVar17 && (iVar4 != iVar7))) {
    lVar16 = uVar15 + 1;
    uVar15 = uVar15 + 1;
    iVar4 = piVar3[lVar16];
  }
  while ((lVar12 < lVar6 && (iVar4 != iVar7))) {
    lVar17 = lVar12 + 1;
    lVar12 = lVar12 + 1;
    iVar7 = piVar2[lVar17];
  }
  if (iVar4 == iVar7) {
    lVar16 = (long)iVar4;
    pnVar1 = (x->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar12 = lVar16 * 0x80;
    lVar6 = 0x1c;
    pnVar10 = pnVar1 + lVar16;
    pcVar11 = &local_b0;
    for (lVar17 = lVar6; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar21 * -2 + 1) * 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar21 * -8 + 4);
    }
    local_b0.exp = pnVar1[lVar16].m_backend.exp;
    local_b0.neg = pnVar1[lVar16].m_backend.neg;
    local_b0.fpclass = pnVar1[lVar16].m_backend.fpclass;
    local_b0.prec_elem = pnVar1[lVar16].m_backend.prec_elem;
    pnVar1 = (y->
             super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             ).val.
             super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    pnVar10 = pnVar1 + lVar16;
    pcVar11 = &local_130;
    for (lVar17 = lVar6; lVar17 != 0; lVar17 = lVar17 + -1) {
      (pcVar11->data)._M_elems[0] = (pnVar10->m_backend).data._M_elems[0];
      pnVar10 = (pointer)((long)pnVar10 + ((ulong)bVar21 * -2 + 1) * 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar21 * -8 + 4);
    }
    local_130.exp = pnVar1[lVar16].m_backend.exp;
    local_130.neg = pnVar1[lVar16].m_backend.neg;
    local_130.fpclass = pnVar1[lVar16].m_backend.fpclass;
    local_130.prec_elem = pnVar1[lVar16].m_backend.prec_elem;
    result.m_backend.fpclass = cpp_dec_float_finite;
    result.m_backend.prec_elem = 0x1c;
    result.m_backend.data._M_elems[0] = 0;
    result.m_backend.data._M_elems[1] = 0;
    result.m_backend.data._M_elems[2] = 0;
    result.m_backend.data._M_elems[3] = 0;
    result.m_backend.data._M_elems[4] = 0;
    result.m_backend.data._M_elems[5] = 0;
    result.m_backend.data._M_elems[6] = 0;
    result.m_backend.data._M_elems[7] = 0;
    result.m_backend.data._M_elems[8] = 0;
    result.m_backend.data._M_elems[9] = 0;
    result.m_backend.data._M_elems[10] = 0;
    result.m_backend.data._M_elems[0xb] = 0;
    result.m_backend.data._M_elems[0xc] = 0;
    result.m_backend.data._M_elems[0xd] = 0;
    result.m_backend.data._M_elems[0xe] = 0;
    result.m_backend.data._M_elems[0xf] = 0;
    result.m_backend.data._M_elems[0x10] = 0;
    result.m_backend.data._M_elems[0x11] = 0;
    result.m_backend.data._M_elems[0x12] = 0;
    result.m_backend.data._M_elems[0x13] = 0;
    result.m_backend.data._M_elems[0x14] = 0;
    result.m_backend.data._M_elems[0x15] = 0;
    result.m_backend.data._M_elems[0x16] = 0;
    result.m_backend.data._M_elems[0x17] = 0;
    result.m_backend.data._M_elems[0x18] = 0;
    result.m_backend.data._M_elems[0x19] = 0;
    result.m_backend.data._M_elems._104_5_ = 0;
    result.m_backend.data._M_elems[0x1b]._1_3_ = 0;
    result.m_backend.exp = 0;
    result.m_backend.neg = false;
    boost::multiprecision::default_ops::
    eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
              (&result.m_backend,&local_b0,&local_130);
    lVar17 = *(long *)(this + 0x20);
    pcVar11 = &result.m_backend;
    puVar13 = (uint *)(lVar17 + lVar12);
    for (; lVar6 != 0; lVar6 = lVar6 + -1) {
      *puVar13 = (pcVar11->data)._M_elems[0];
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar21 * -8 + 4);
      puVar13 = puVar13 + (ulong)bVar21 * -2 + 1;
    }
    *(int *)(lVar17 + 0x70 + lVar12) = result.m_backend.exp;
    *(bool *)(lVar17 + 0x74 + lVar12) = result.m_backend.neg;
    *(undefined8 *)(lVar17 + 0x78 + lVar12) = result.m_backend._120_8_;
  }
  goto LAB_004316ad;
LAB_0043143a:
  lVar12 = (long)iVar18;
  iVar18 = iVar18 + 1;
  piVar8 = piVar2 + lVar12 + 1;
  goto LAB_0043140f;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::assignPWproduct4setup(const SSVectorBase<S>& x,
      const SSVectorBase<T>& y)
{
   assert(dim() == x.dim());
   assert(x.dim() == y.dim());
   assert(x.isSetup());
   assert(y.isSetup());

   clear();
   setupStatus = false;

   int i = 0;
   int j = 0;
   int n = x.size() - 1;
   int m = y.size() - 1;

   /* both x and y non-zero vectors? */
   if(m >= 0 && n >= 0)
   {
      int xi = x.index(i);
      int yj = y.index(j);

      while(i < n && j < m)
      {
         if(xi == yj)
         {
            VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
            xi = x.index(++i);
            yj = y.index(++j);
         }
         else if(xi < yj)
            xi = x.index(++i);
         else
            yj = y.index(++j);
      }

      /* check (possible) remaining indices */

      while(i < n && xi != yj)
         xi = x.index(++i);

      while(j < m && xi != yj)
         yj = y.index(++j);

      if(xi == yj)
         VectorBase<R>::val[xi] = R(x.val[xi]) * R(y.val[xi]);
   }

   setup();

   assert(isConsistent());

   return *this;
}